

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jccolor.c
# Opt level: O1

void rgb_gray_convert(j_compress_ptr cinfo,JSAMPARRAY input_buf,JSAMPIMAGE output_buf,
                     JDIMENSION output_row,int num_rows)

{
  uint uVar1;
  _func_void_j_compress_ptr *p_Var2;
  JSAMPROW pJVar3;
  bool bVar4;
  byte *pbVar5;
  ulong uVar6;
  
  if (0 < num_rows) {
    p_Var2 = cinfo->cconvert[1].start_pass;
    uVar1 = cinfo->image_width;
    do {
      if ((ulong)uVar1 != 0) {
        pJVar3 = (*output_buf)[output_row];
        pbVar5 = *input_buf;
        uVar6 = 0;
        do {
          pJVar3[uVar6] =
               (JSAMPLE)((uint)(*(int *)(p_Var2 + (ulong)pbVar5[1] * 8 + 0x800) +
                                *(int *)(p_Var2 + (ulong)*pbVar5 * 8) +
                               *(int *)(p_Var2 + (ulong)pbVar5[2] * 8 + 0x1000)) >> 0x10);
          uVar6 = uVar6 + 1;
          pbVar5 = pbVar5 + 3;
        } while (uVar1 != uVar6);
      }
      input_buf = input_buf + 1;
      output_row = output_row + 1;
      bVar4 = 1 < num_rows;
      num_rows = num_rows + -1;
    } while (bVar4);
  }
  return;
}

Assistant:

METHODDEF(void)
rgb_gray_convert (j_compress_ptr cinfo,
		  JSAMPARRAY input_buf, JSAMPIMAGE output_buf,
		  JDIMENSION output_row, int num_rows)
{
  my_cconvert_ptr cconvert = (my_cconvert_ptr) cinfo->cconvert;
  register int r, g, b;
  register INT32 * ctab = cconvert->rgb_ycc_tab;
  register JSAMPROW inptr;
  register JSAMPROW outptr;
  register JDIMENSION col;
  JDIMENSION num_cols = cinfo->image_width;

  while (--num_rows >= 0) {
    inptr = *input_buf++;
    outptr = output_buf[0][output_row];
    output_row++;
    for (col = 0; col < num_cols; col++) {
      r = GETJSAMPLE(inptr[RGB_RED]);
      g = GETJSAMPLE(inptr[RGB_GREEN]);
      b = GETJSAMPLE(inptr[RGB_BLUE]);
      inptr += RGB_PIXELSIZE;
      /* Y */
      outptr[col] = (JSAMPLE)
		((ctab[r+R_Y_OFF] + ctab[g+G_Y_OFF] + ctab[b+B_Y_OFF])
		 >> SCALEBITS);
    }
  }
}